

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O0

int __thiscall
TCPListener::accept(TCPListener *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  TCPListenerError *pTVar1;
  int *piVar2;
  undefined4 in_register_00000034;
  allocator local_91;
  string local_90 [36];
  int local_6c;
  int local_68;
  int x;
  int newSocketDescriptor;
  Address remoteAddress;
  socklen_t remoteAddressLength;
  allocator local_39;
  string local_38 [32];
  TCPListener *local_18;
  TCPListener *this_local;
  
  local_18 = this;
  if ((this->listening & 1U) == 0) {
    remoteAddress.sin_zero[7] = '\x01';
    pTVar1 = (TCPListenerError *)__cxa_allocate_exception(0x30,CONCAT44(in_register_00000034,__fd));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"Could not accept while TCPListener is not listening",&local_39);
    TCPListenerError::TCPListenerError(pTVar1,(string *)local_38,0);
    remoteAddress.sin_zero[7] = '\0';
    __cxa_throw(pTVar1,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  local_68 = accept4((this->super_Socket).socketDescriptor,(sockaddr *)&x,
                     (socklen_t *)remoteAddress.sin_zero,0);
  if (local_68 < 0) {
    piVar2 = __errno_location();
    local_6c = *piVar2;
    pTVar1 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Could not accept connection",&local_91);
    TCPListenerError::TCPListenerError(pTVar1,(string *)local_90,local_6c);
    __cxa_throw(pTVar1,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  TCPSocket::TCPSocket((TCPSocket *)&this_local,local_68);
  return (int)this_local;
}

Assistant:

TCPSocket TCPListener::accept()
{
    if(!listening){
        throw TCPListenerError("Could not accept while TCPListener is not listening");
    }

    socklen_t remoteAddressLength;
    Address remoteAddress;
    int newSocketDescriptor = ::accept4(socketDescriptor, (sockaddr*)&remoteAddress, &remoteAddressLength, 0);

    if(newSocketDescriptor < 0)
    {
        int x = errno;
        throw TCPListenerError("Could not accept connection", x);
    }
    else
    {
        return TCPSocket(newSocketDescriptor);
    }
}